

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

int Gia_ManBalanceGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int *pLits,int nLits)

{
  int *pCosts;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = Gia_ObjIsBuf(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x11f,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)"
                 );
  }
  vSuper->nSize = 0;
  if (nLits == 2) {
    Vec_IntPush(vSuper,*pLits);
    Vec_IntPush(vSuper,pLits[1]);
    Gia_ManCreateGate(pNew,pObj,vSuper);
LAB_005a5093:
    iVar1 = vSuper->nSize;
  }
  else {
    if (nLits == 1) {
      Vec_IntPush(vSuper,*pLits);
      goto LAB_005a5093;
    }
    if (nLits < 3) goto LAB_005a518f;
    uVar2 = (ulong)(uint)nLits;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = Abc_Lit2Var(pLits[uVar3]);
      iVar1 = Gia_ObjLevelId(pNew,iVar1);
      Vec_IntPush(vSuper,iVar1);
    }
    Vec_IntGrow(vSuper,nLits * 4);
    pCosts = vSuper->pArray;
    Abc_QuickSortCostData(pCosts,nLits,1,(word *)(pCosts + (uint)(nLits * 2)),pCosts + uVar2);
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      Vec_IntWriteEntry(vSuper,(int)uVar3,pLits[(pCosts + uVar2)[uVar3]]);
    }
    Vec_IntShrink(vSuper,nLits);
    while (iVar1 = vSuper->nSize, 1 < iVar1) {
      iVar1 = Gia_ObjIsXor(pObj);
      if (iVar1 == 0) {
        Gia_ManPrepareLastTwo(pNew,vSuper);
      }
      Gia_ManCreateGate(pNew,pObj,vSuper);
    }
  }
  if (iVar1 == 1) {
    iVar1 = Vec_IntEntry(vSuper,0);
    return iVar1;
  }
LAB_005a518f:
  __assert_fail("Vec_IntSize(vSuper) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                ,0x146,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)");
}

Assistant:

int Gia_ManBalanceGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int * pLits, int nLits )
{
    assert( !Gia_ObjIsBuf(pObj) );
    Vec_IntClear( vSuper );
    if ( nLits == 1 )
        Vec_IntPush( vSuper, pLits[0] );
    else if ( nLits == 2 )
    {
        Vec_IntPush( vSuper, pLits[0] );
        Vec_IntPush( vSuper, pLits[1] );
        Gia_ManCreateGate( pNew, pObj, vSuper );
    }
    else if ( nLits > 2 )
    {
        // collect levels
        int i, * pArray, * pPerm; //int iLit;
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vSuper, Gia_ObjLevelId(pNew, Abc_Lit2Var(pLits[i])) );
        // sort by level
        Vec_IntGrow( vSuper, 4 * nLits );        
        pArray = Vec_IntArray( vSuper );
        pPerm = pArray + nLits;
        Abc_QuickSortCostData( pArray, nLits, 1, (word *)(pArray + 2 * nLits), pPerm );
        // collect in the increasing order of level
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vSuper, i, pLits[pPerm[i]] );
        Vec_IntShrink( vSuper, nLits );
/*            
        Vec_IntForEachEntry( vSuper, iLit, i )
            printf( "%d ", Gia_ObjLevel(pNew, Gia_ManObj( pNew, Abc_Lit2Var(iLit) )) );
        printf( "\n" );
*/
        // perform incremental extraction
        while ( Vec_IntSize(vSuper) > 1 )
        {
            if ( !Gia_ObjIsXor(pObj) )
                Gia_ManPrepareLastTwo( pNew, vSuper );
            Gia_ManCreateGate( pNew, pObj, vSuper );
        }
    }
    // consider trivial case
    assert( Vec_IntSize(vSuper) == 1 );
    return Vec_IntEntry(vSuper, 0);
}